

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1048576,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCRayQueryContext *pRVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  byte bVar17;
  int iVar18;
  ulong *puVar19;
  ulong uVar20;
  ulong uVar21;
  ulong unaff_RBP;
  size_t mask;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined4 uVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  undefined1 in_ZMM9 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_260c;
  int local_25f4;
  RTCIntersectArguments *local_25f0;
  ulong local_25e8;
  Geometry *local_25e0;
  ulong local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  ulong local_25c0;
  ulong local_25b8;
  ulong *local_25b0;
  Scene *local_25a8;
  ulong local_25a0;
  RTCFilterFunctionNArguments local_2598;
  float local_2568;
  undefined4 local_2564;
  undefined4 local_2560;
  float local_255c;
  float local_2558;
  undefined4 local_2554;
  uint local_2550;
  uint local_254c;
  uint local_2548;
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  byte local_24f7;
  float local_24e8 [4];
  float local_24d8 [4];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar43 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      local_25b0 = local_2368;
      auVar29 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar26._8_4_ = 0x7fffffff;
      auVar26._0_8_ = 0x7fffffff7fffffff;
      auVar26._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx512vl((undefined1  [16])aVar2,auVar26);
      auVar63._8_4_ = 0x219392ef;
      auVar63._0_8_ = 0x219392ef219392ef;
      auVar63._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar26,auVar63,1);
      bVar4 = (bool)((byte)uVar24 & 1);
      auVar27._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
      bVar4 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
      bVar4 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
      bVar4 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
      auVar26 = vrcp14ps_avx512vl(auVar27);
      auVar28._8_4_ = 0x3f800000;
      auVar28._0_8_ = &DAT_3f8000003f800000;
      auVar28._12_4_ = 0x3f800000;
      auVar28 = vfnmadd213ps_avx512vl(auVar27,auVar26,auVar28);
      auVar27 = vfmadd132ps_fma(auVar28,auVar26,auVar26);
      auVar40 = vbroadcastss_avx512vl(auVar27);
      auVar75 = ZEXT3264(auVar40);
      auVar26 = vmovshdup_avx(auVar27);
      auVar40 = vbroadcastsd_avx512vl(auVar26);
      auVar76 = ZEXT3264(auVar40);
      auVar46._8_4_ = 2;
      auVar46._0_8_ = 0x200000002;
      auVar46._12_4_ = 2;
      auVar46._16_4_ = 2;
      auVar46._20_4_ = 2;
      auVar46._24_4_ = 2;
      auVar46._28_4_ = 2;
      auVar28 = vshufpd_avx(auVar27,auVar27,1);
      auVar40 = vpermps_avx512vl(auVar46,ZEXT1632(auVar27));
      auVar77 = ZEXT3264(auVar40);
      fVar48 = auVar27._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar78 = ZEXT3264(auVar40);
      auVar65._4_4_ = fVar48;
      auVar65._0_4_ = fVar48;
      auVar65._8_4_ = fVar48;
      auVar65._12_4_ = fVar48;
      auVar65._16_4_ = fVar48;
      auVar65._20_4_ = fVar48;
      auVar65._24_4_ = fVar48;
      auVar65._28_4_ = fVar48;
      auVar42 = ZEXT1632(CONCAT412(auVar27._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar27._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar27._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar48))));
      auVar41 = vpermps_avx512vl(auVar40,auVar42);
      auVar40 = vpermps_avx2(auVar46,auVar42);
      uVar58 = auVar37._0_4_;
      auVar52 = ZEXT3264(CONCAT428(uVar58,CONCAT424(uVar58,CONCAT420(uVar58,CONCAT416(uVar58,
                                                  CONCAT412(uVar58,CONCAT48(uVar58,CONCAT44(uVar58,
                                                  uVar58))))))));
      local_25b8 = (ulong)(auVar27._0_4_ < 0.0) << 3;
      local_25c0 = local_25b8 ^ 8;
      local_25c8 = (ulong)((uint)(auVar26._0_4_ < 0.0) * 8 + 0x10);
      local_25d0 = local_25c8 ^ 8;
      local_25d8 = (ulong)((uint)(auVar28._0_4_ < 0.0) * 8 + 0x20);
      auVar43._8_4_ = 0x80000000;
      auVar43._0_8_ = 0x8000000080000000;
      auVar43._12_4_ = 0x80000000;
      auVar43._16_4_ = 0x80000000;
      auVar43._20_4_ = 0x80000000;
      auVar43._24_4_ = 0x80000000;
      auVar43._28_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(auVar65,auVar43);
      auVar79 = ZEXT3264(auVar42);
      auVar41 = vxorps_avx512vl(auVar41,auVar43);
      auVar80 = ZEXT3264(auVar41);
      auVar40 = vxorps_avx512vl(auVar40,auVar43);
      auVar81 = ZEXT3264(auVar40);
      auVar40 = vbroadcastss_avx512vl(auVar29);
      auVar82 = ZEXT3264(auVar40);
      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar83 = ZEXT3264(auVar40);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar84 = ZEXT3264(auVar40);
      auVar29 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar85 = ZEXT1664(auVar29);
      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar86 = ZEXT3264(auVar40);
      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar87 = ZEXT3264(auVar40);
      local_25a0 = local_25d8 ^ 8;
      uVar24 = local_25d8 ^ 8;
      do {
        do {
          do {
            if (local_25b0 == &local_2378) {
              return;
            }
            pfVar1 = (float *)(local_25b0 + -1);
            local_25b0 = local_25b0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar1);
          uVar25 = *local_25b0;
          do {
            if ((uVar25 & 8) == 0) {
              puVar19 = (ulong *)((uVar25 & 0xfffffffffffffff0) + 0x40);
              if ((uVar25 & 0xfffffffffffffff0) == 0) {
                puVar19 = (ulong *)0x0;
              }
              auVar34._8_8_ = 0;
              auVar34._0_8_ = *puVar19;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = puVar19[1];
              uVar7 = vpcmpub_avx512vl(auVar34,auVar35,2);
              uVar58 = (undefined4)puVar19[6];
              auVar41._4_4_ = uVar58;
              auVar41._0_4_ = uVar58;
              auVar41._8_4_ = uVar58;
              auVar41._12_4_ = uVar58;
              auVar41._16_4_ = uVar58;
              auVar41._20_4_ = uVar58;
              auVar41._24_4_ = uVar58;
              auVar41._28_4_ = uVar58;
              uVar58 = *(undefined4 *)((long)puVar19 + 0x3c);
              auVar45._4_4_ = uVar58;
              auVar45._0_4_ = uVar58;
              auVar45._8_4_ = uVar58;
              auVar45._12_4_ = uVar58;
              auVar45._16_4_ = uVar58;
              auVar45._20_4_ = uVar58;
              auVar45._24_4_ = uVar58;
              auVar45._28_4_ = uVar58;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)((long)puVar19 + local_25b8);
              auVar40 = vpmovzxbd_avx2(auVar29);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar29 = vfmadd213ps_fma(auVar40,auVar45,auVar41);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)((long)puVar19 + local_25c0);
              auVar40 = vpmovzxbd_avx2(auVar37);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar37 = vfmadd213ps_fma(auVar40,auVar45,auVar41);
              uVar58 = *(undefined4 *)((long)puVar19 + 0x34);
              auVar42._4_4_ = uVar58;
              auVar42._0_4_ = uVar58;
              auVar42._8_4_ = uVar58;
              auVar42._12_4_ = uVar58;
              auVar42._16_4_ = uVar58;
              auVar42._20_4_ = uVar58;
              auVar42._24_4_ = uVar58;
              auVar42._28_4_ = uVar58;
              uVar58 = (undefined4)puVar19[8];
              auVar56._4_4_ = uVar58;
              auVar56._0_4_ = uVar58;
              auVar56._8_4_ = uVar58;
              auVar56._12_4_ = uVar58;
              auVar56._16_4_ = uVar58;
              auVar56._20_4_ = uVar58;
              auVar56._24_4_ = uVar58;
              auVar56._28_4_ = uVar58;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = *(ulong *)((long)puVar19 + local_25c8);
              auVar40 = vpmovzxbd_avx2(auVar33);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar26 = vfmadd213ps_fma(auVar40,auVar56,auVar42);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)((long)puVar19 + local_25d0);
              auVar40 = vpmovzxbd_avx2(auVar30);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar28 = vfmadd213ps_fma(auVar40,auVar56,auVar42);
              uVar58 = (undefined4)puVar19[7];
              auVar54._4_4_ = uVar58;
              auVar54._0_4_ = uVar58;
              auVar54._8_4_ = uVar58;
              auVar54._12_4_ = uVar58;
              auVar54._16_4_ = uVar58;
              auVar54._20_4_ = uVar58;
              auVar54._24_4_ = uVar58;
              auVar54._28_4_ = uVar58;
              uVar58 = *(undefined4 *)((long)puVar19 + 0x44);
              auVar57._4_4_ = uVar58;
              auVar57._0_4_ = uVar58;
              auVar57._8_4_ = uVar58;
              auVar57._12_4_ = uVar58;
              auVar57._16_4_ = uVar58;
              auVar57._20_4_ = uVar58;
              auVar57._24_4_ = uVar58;
              auVar57._28_4_ = uVar58;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)((long)puVar19 + local_25d8);
              auVar40 = vpmovzxbd_avx2(auVar31);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar27 = vfmadd213ps_fma(auVar40,auVar57,auVar54);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = *(ulong *)((long)puVar19 + uVar24);
              auVar40 = vpmovzxbd_avx2(auVar32);
              auVar40 = vcvtdq2ps_avx(auVar40);
              auVar63 = vfmadd213ps_fma(auVar40,auVar57,auVar54);
              auVar40 = vfmadd213ps_avx512vl(ZEXT1632(auVar29),auVar75._0_32_,auVar79._0_32_);
              auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar26),auVar76._0_32_,auVar80._0_32_);
              auVar40 = vpmaxsd_avx2(auVar40,auVar41);
              auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar27),auVar77._0_32_,auVar81._0_32_);
              auVar41 = vpmaxsd_avx512vl(auVar41,auVar82._0_32_);
              auVar40 = vpmaxsd_avx2(auVar40,auVar41);
              in_ZMM9 = ZEXT3264(auVar40);
              auVar41 = vfmadd213ps_avx512vl(ZEXT1632(auVar37),auVar75._0_32_,auVar79._0_32_);
              auVar42 = vfmadd213ps_avx512vl(ZEXT1632(auVar28),auVar76._0_32_,auVar80._0_32_);
              auVar41 = vpminsd_avx2(auVar41,auVar42);
              auVar42 = vfmadd213ps_avx512vl(ZEXT1632(auVar63),auVar77._0_32_,auVar81._0_32_);
              auVar42 = vpminsd_avx2(auVar42,auVar52._0_32_);
              auVar41 = vpminsd_avx2(auVar41,auVar42);
              uVar8 = vpcmpd_avx512vl(auVar40,auVar41,2);
              unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),(uint)(byte)((byte)uVar7 & (byte)uVar8))
              ;
            }
            local_2398 = in_ZMM9._0_32_;
            if ((uVar25 & 8) == 0) {
              if (unaff_RBP == 0) {
                iVar18 = 4;
              }
              else {
                auVar40 = *(undefined1 (*) [32])(uVar25 & 0xfffffffffffffff0);
                auVar41 = ((undefined1 (*) [32])(uVar25 & 0xfffffffffffffff0))[1];
                auVar42 = vmovdqa64_avx512vl(auVar83._0_32_);
                auVar42 = vpternlogd_avx512vl(auVar42,local_2398,auVar84._0_32_,0xf8);
                uVar25 = unaff_RBP & 0xffffffff;
                auVar43 = vpcompressd_avx512vl(auVar42);
                bVar4 = (bool)((byte)uVar25 & 1);
                auVar44._0_4_ = (uint)bVar4 * auVar43._0_4_ | (uint)!bVar4 * auVar42._0_4_;
                bVar4 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar4 * auVar43._4_4_ | (uint)!bVar4 * auVar42._4_4_;
                bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar4 * auVar43._8_4_ | (uint)!bVar4 * auVar42._8_4_;
                bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
                auVar44._12_4_ = (uint)bVar4 * auVar43._12_4_ | (uint)!bVar4 * auVar42._12_4_;
                bVar4 = (bool)((byte)(uVar25 >> 4) & 1);
                auVar44._16_4_ = (uint)bVar4 * auVar43._16_4_ | (uint)!bVar4 * auVar42._16_4_;
                bVar4 = (bool)((byte)(uVar25 >> 5) & 1);
                auVar44._20_4_ = (uint)bVar4 * auVar43._20_4_ | (uint)!bVar4 * auVar42._20_4_;
                bVar4 = (bool)((byte)(uVar25 >> 6) & 1);
                auVar44._24_4_ = (uint)bVar4 * auVar43._24_4_ | (uint)!bVar4 * auVar42._24_4_;
                bVar4 = (bool)((byte)(uVar25 >> 7) & 1);
                auVar44._28_4_ = (uint)bVar4 * auVar43._28_4_ | (uint)!bVar4 * auVar42._28_4_;
                auVar42 = vpermt2q_avx512vl(auVar40,auVar44,auVar41);
                uVar25 = auVar42._0_8_;
                iVar18 = 0;
                uVar21 = unaff_RBP - 1 & unaff_RBP;
                if (uVar21 != 0) {
                  auVar42 = vpshufd_avx2(auVar44,0x55);
                  vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                  auVar43 = vpminsd_avx2(auVar44,auVar42);
                  auVar42 = vpmaxsd_avx2(auVar44,auVar42);
                  uVar21 = uVar21 - 1 & uVar21;
                  if (uVar21 == 0) {
                    auVar43 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
                    uVar25 = auVar43._0_8_;
                    auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                    *local_25b0 = auVar40._0_8_;
                    auVar40 = vpermd_avx2(auVar42,local_2398);
                    *(int *)(local_25b0 + 1) = auVar40._0_4_;
                    local_25b0 = local_25b0 + 2;
                  }
                  else {
                    auVar65 = vpshufd_avx2(auVar44,0xaa);
                    vpermt2q_avx512vl(auVar40,auVar65,auVar41);
                    auVar46 = vpminsd_avx2(auVar43,auVar65);
                    auVar43 = vpmaxsd_avx2(auVar43,auVar65);
                    auVar65 = vpminsd_avx2(auVar42,auVar43);
                    auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                    uVar21 = uVar21 - 1 & uVar21;
                    if (uVar21 == 0) {
                      auVar43 = vpermi2q_avx512vl(auVar46,auVar40,auVar41);
                      uVar25 = auVar43._0_8_;
                      auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                      *local_25b0 = auVar43._0_8_;
                      auVar42 = vpermd_avx2(auVar42,local_2398);
                      *(int *)(local_25b0 + 1) = auVar42._0_4_;
                      auVar40 = vpermt2q_avx512vl(auVar40,auVar65,auVar41);
                      local_25b0[2] = auVar40._0_8_;
                      auVar40 = vpermd_avx2(auVar65,local_2398);
                      *(int *)(local_25b0 + 3) = auVar40._0_4_;
                      local_25b0 = local_25b0 + 4;
                    }
                    else {
                      auVar43 = vpshufd_avx2(auVar44,0xff);
                      vpermt2q_avx512vl(auVar40,auVar43,auVar41);
                      auVar54 = vpminsd_avx2(auVar46,auVar43);
                      auVar43 = vpmaxsd_avx2(auVar46,auVar43);
                      auVar46 = vpminsd_avx2(auVar65,auVar43);
                      auVar43 = vpmaxsd_avx2(auVar65,auVar43);
                      auVar65 = vpminsd_avx2(auVar42,auVar43);
                      auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                      uVar21 = uVar21 - 1 & uVar21;
                      if (uVar21 == 0) {
                        auVar43 = vpermi2q_avx512vl(auVar54,auVar40,auVar41);
                        uVar25 = auVar43._0_8_;
                        auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                        *local_25b0 = auVar43._0_8_;
                        auVar42 = vpermd_avx2(auVar42,local_2398);
                        *(int *)(local_25b0 + 1) = auVar42._0_4_;
                        auVar42 = vpermt2q_avx512vl(auVar40,auVar65,auVar41);
                        local_25b0[2] = auVar42._0_8_;
                        auVar42 = vpermd_avx2(auVar65,local_2398);
                        *(int *)(local_25b0 + 3) = auVar42._0_4_;
                        auVar40 = vpermt2q_avx512vl(auVar40,auVar46,auVar41);
                        local_25b0[4] = auVar40._0_8_;
                        auVar40 = vpermd_avx2(auVar46,local_2398);
                        *(int *)(local_25b0 + 5) = auVar40._0_4_;
                        local_25b0 = local_25b0 + 6;
                      }
                      else {
                        auVar45 = valignd_avx512vl(auVar44,auVar44,3);
                        auVar43 = vmovdqa64_avx512vl(auVar85._0_32_);
                        auVar43 = vpermt2d_avx512vl(auVar43,auVar86._0_32_,auVar54);
                        auVar43 = vpermt2d_avx512vl(auVar43,auVar87._0_32_,auVar46);
                        auVar46 = vpermt2d_avx512vl(auVar43,auVar87._0_32_,auVar65);
                        auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar42 = vpermt2d_avx512vl(auVar46,auVar43,auVar42);
                        auVar59 = ZEXT3264(auVar42);
                        uVar25 = uVar21;
                        do {
                          auVar43 = auVar59._0_32_;
                          auVar42 = vpermps_avx512vl(auVar78._0_32_,auVar45);
                          auVar45 = valignd_avx512vl(auVar45,auVar45,1);
                          vpermt2q_avx512vl(auVar40,auVar45,auVar41);
                          uVar25 = uVar25 - 1 & uVar25;
                          uVar7 = vpcmpd_avx512vl(auVar42,auVar43,5);
                          auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                          bVar17 = (byte)uVar7 << 1;
                          auVar43 = valignd_avx512vl(auVar43,auVar43,7);
                          bVar4 = (bool)((byte)uVar7 & 1);
                          auVar47._4_4_ = (uint)bVar4 * auVar43._4_4_ | (uint)!bVar4 * auVar42._4_4_
                          ;
                          auVar47._0_4_ = auVar42._0_4_;
                          bVar4 = (bool)(bVar17 >> 2 & 1);
                          auVar47._8_4_ = (uint)bVar4 * auVar43._8_4_ | (uint)!bVar4 * auVar42._8_4_
                          ;
                          bVar4 = (bool)(bVar17 >> 3 & 1);
                          auVar47._12_4_ =
                               (uint)bVar4 * auVar43._12_4_ | (uint)!bVar4 * auVar42._12_4_;
                          bVar4 = (bool)(bVar17 >> 4 & 1);
                          auVar47._16_4_ =
                               (uint)bVar4 * auVar43._16_4_ | (uint)!bVar4 * auVar42._16_4_;
                          bVar4 = (bool)(bVar17 >> 5 & 1);
                          auVar47._20_4_ =
                               (uint)bVar4 * auVar43._20_4_ | (uint)!bVar4 * auVar42._20_4_;
                          bVar4 = (bool)(bVar17 >> 6 & 1);
                          auVar47._24_4_ =
                               (uint)bVar4 * auVar43._24_4_ | (uint)!bVar4 * auVar42._24_4_;
                          auVar47._28_4_ =
                               (uint)(bVar17 >> 7) * auVar43._28_4_ |
                               (uint)!(bool)(bVar17 >> 7) * auVar42._28_4_;
                          auVar59 = ZEXT3264(auVar47);
                        } while (uVar25 != 0);
                        lVar23 = POPCOUNT(uVar21) + 3;
                        do {
                          auVar42 = vpermi2q_avx512vl(auVar47,auVar40,auVar41);
                          *local_25b0 = auVar42._0_8_;
                          auVar43 = auVar59._0_32_;
                          auVar42 = vpermd_avx2(auVar43,local_2398);
                          *(int *)(local_25b0 + 1) = auVar42._0_4_;
                          auVar47 = valignd_avx512vl(auVar43,auVar43,1);
                          local_25b0 = local_25b0 + 2;
                          auVar59 = ZEXT3264(auVar47);
                          lVar23 = lVar23 + -1;
                        } while (lVar23 != 0);
                        auVar40 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                        uVar25 = auVar40._0_8_;
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar18 = 6;
            }
          } while (iVar18 == 0);
        } while (iVar18 != 6);
        uVar24 = (ulong)((uint)uVar25 & 0xf);
        if (uVar24 != 8) {
          uVar25 = uVar25 & 0xfffffffffffffff0;
          lVar23 = 0;
          do {
            lVar22 = lVar23 * 0xb0;
            auVar29 = *(undefined1 (*) [16])(uVar25 + 0x80 + lVar22);
            auVar37 = *(undefined1 (*) [16])(uVar25 + 0x40 + lVar22);
            auVar26 = *(undefined1 (*) [16])(uVar25 + 0x70 + lVar22);
            auVar28 = *(undefined1 (*) [16])(uVar25 + 0x50 + lVar22);
            auVar49._0_4_ = auVar37._0_4_ * auVar29._0_4_;
            auVar49._4_4_ = auVar37._4_4_ * auVar29._4_4_;
            auVar49._8_4_ = auVar37._8_4_ * auVar29._8_4_;
            auVar49._12_4_ = auVar37._12_4_ * auVar29._12_4_;
            auVar27 = *(undefined1 (*) [16])(uVar25 + 0x60 + lVar22);
            auVar63 = *(undefined1 (*) [16])(uVar25 + 0x30 + lVar22);
            local_24b8 = vfmsub231ps_fma(auVar49,auVar26,auVar28);
            auVar53._0_4_ = auVar28._0_4_ * auVar27._0_4_;
            auVar53._4_4_ = auVar28._4_4_ * auVar27._4_4_;
            auVar53._8_4_ = auVar28._8_4_ * auVar27._8_4_;
            auVar53._12_4_ = auVar28._12_4_ * auVar27._12_4_;
            local_24a8 = vfmsub231ps_fma(auVar53,auVar29,auVar63);
            auVar55._0_4_ = auVar63._0_4_ * auVar26._0_4_;
            auVar55._4_4_ = auVar63._4_4_ * auVar26._4_4_;
            auVar55._8_4_ = auVar63._8_4_ * auVar26._8_4_;
            auVar55._12_4_ = auVar63._12_4_ * auVar26._12_4_;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar71._4_4_ = uVar58;
            auVar71._0_4_ = uVar58;
            auVar71._8_4_ = uVar58;
            auVar71._12_4_ = uVar58;
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar72._4_4_ = uVar58;
            auVar72._0_4_ = uVar58;
            auVar72._8_4_ = uVar58;
            auVar72._12_4_ = uVar58;
            fVar48 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar73._4_4_ = fVar48;
            auVar73._0_4_ = fVar48;
            auVar73._8_4_ = fVar48;
            auVar73._12_4_ = fVar48;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar36._4_4_ = uVar58;
            auVar36._0_4_ = uVar58;
            auVar36._8_4_ = uVar58;
            auVar36._12_4_ = uVar58;
            auVar30 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + lVar22),auVar36);
            local_2498 = vfmsub231ps_fma(auVar55,auVar27,auVar37);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar9._4_4_ = uVar58;
            auVar9._0_4_ = uVar58;
            auVar9._8_4_ = uVar58;
            auVar9._12_4_ = uVar58;
            auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x10 + lVar22),auVar9);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar10._4_4_ = uVar58;
            auVar10._0_4_ = uVar58;
            auVar10._8_4_ = uVar58;
            auVar10._12_4_ = uVar58;
            auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar25 + 0x20 + lVar22),auVar10);
            auVar33 = vmulps_avx512vl(auVar72,auVar32);
            auVar34 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar73);
            auVar33 = vmulps_avx512vl(auVar73,auVar30);
            auVar35 = vfmsub231ps_avx512vl(auVar33,auVar32,auVar71);
            auVar33 = vmulps_avx512vl(auVar71,auVar31);
            auVar36 = vfmsub231ps_avx512vl(auVar33,auVar30,auVar72);
            auVar74._0_4_ = fVar48 * local_2498._0_4_;
            auVar74._4_4_ = fVar48 * local_2498._4_4_;
            auVar74._8_4_ = fVar48 * local_2498._8_4_;
            auVar74._12_4_ = fVar48 * local_2498._12_4_;
            auVar33 = vfmadd231ps_fma(auVar74,local_24a8,auVar72);
            auVar33 = vfmadd231ps_fma(auVar33,local_24b8,auVar71);
            auVar11._8_4_ = 0x7fffffff;
            auVar11._0_8_ = 0x7fffffff7fffffff;
            auVar11._12_4_ = 0x7fffffff;
            local_2508 = vandps_avx512vl(auVar33,auVar11);
            auVar29 = vmulps_avx512vl(auVar29,auVar36);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar35,auVar26);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar34,auVar27);
            auVar12._8_4_ = 0x80000000;
            auVar12._0_8_ = 0x8000000080000000;
            auVar12._12_4_ = 0x80000000;
            auVar26 = vandpd_avx512vl(auVar33,auVar12);
            uVar66 = auVar26._0_4_;
            local_2538._0_4_ = (float)(uVar66 ^ auVar29._0_4_);
            uVar67 = auVar26._4_4_;
            local_2538._4_4_ = (float)(uVar67 ^ auVar29._4_4_);
            uVar68 = auVar26._8_4_;
            local_2538._8_4_ = (float)(uVar68 ^ auVar29._8_4_);
            uVar69 = auVar26._12_4_;
            local_2538._12_4_ = (float)(uVar69 ^ auVar29._12_4_);
            auVar29 = vmulps_avx512vl(auVar28,auVar36);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar37,auVar35);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar63,auVar34);
            local_2528._0_4_ = (float)(uVar66 ^ auVar29._0_4_);
            local_2528._4_4_ = (float)(uVar67 ^ auVar29._4_4_);
            local_2528._8_4_ = (float)(uVar68 ^ auVar29._8_4_);
            local_2528._12_4_ = (float)(uVar69 ^ auVar29._12_4_);
            auVar29 = ZEXT816(0) << 0x20;
            uVar7 = vcmpps_avx512vl(local_2538,auVar29,5);
            uVar8 = vcmpps_avx512vl(local_2528,auVar29,5);
            uVar5 = vcmpps_avx512vl(auVar33,auVar29,4);
            auVar70._0_4_ = local_2528._0_4_ + local_2538._0_4_;
            auVar70._4_4_ = local_2528._4_4_ + local_2538._4_4_;
            auVar70._8_4_ = local_2528._8_4_ + local_2538._8_4_;
            auVar70._12_4_ = local_2528._12_4_ + local_2538._12_4_;
            uVar6 = vcmpps_avx512vl(auVar70,local_2508,2);
            local_24f7 = (byte)uVar7 & (byte)uVar8 & (byte)uVar5 & (byte)uVar6;
            if (local_24f7 != 0) {
              auVar64._0_4_ = local_2498._0_4_ * auVar32._0_4_;
              auVar64._4_4_ = local_2498._4_4_ * auVar32._4_4_;
              auVar64._8_4_ = local_2498._8_4_ * auVar32._8_4_;
              auVar64._12_4_ = local_2498._12_4_ * auVar32._12_4_;
              auVar29 = vfmadd213ps_fma(auVar31,local_24a8,auVar64);
              auVar29 = vfmadd213ps_fma(auVar30,local_24b8,auVar29);
              local_2518._0_4_ = (float)(uVar66 ^ auVar29._0_4_);
              local_2518._4_4_ = (float)(uVar67 ^ auVar29._4_4_);
              local_2518._8_4_ = (float)(uVar68 ^ auVar29._8_4_);
              local_2518._12_4_ = (float)(uVar69 ^ auVar29._12_4_);
              uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar13._4_4_ = uVar58;
              auVar13._0_4_ = uVar58;
              auVar13._8_4_ = uVar58;
              auVar13._12_4_ = uVar58;
              auVar29 = vmulps_avx512vl(local_2508,auVar13);
              fVar48 = (ray->super_RayK<1>).tfar;
              auVar14._4_4_ = fVar48;
              auVar14._0_4_ = fVar48;
              auVar14._8_4_ = fVar48;
              auVar14._12_4_ = fVar48;
              auVar37 = vmulps_avx512vl(local_2508,auVar14);
              uVar7 = vcmpps_avx512vl(local_2518,auVar37,2);
              uVar8 = vcmpps_avx512vl(auVar29,local_2518,1);
              local_24f7 = (byte)uVar7 & (byte)uVar8 & local_24f7;
              if (local_24f7 != 0) {
                lVar22 = lVar22 + uVar25;
                auVar29 = vrcp14ps_avx512vl(local_2508);
                auVar15._8_4_ = 0x3f800000;
                auVar15._0_8_ = &DAT_3f8000003f800000;
                auVar15._12_4_ = 0x3f800000;
                auVar37 = vfnmadd213ps_avx512vl(local_2508,auVar29,auVar15);
                auVar29 = vfmadd132ps_fma(auVar37,auVar29,auVar29);
                fVar48 = auVar29._0_4_;
                local_24c8._0_4_ = fVar48 * local_2518._0_4_;
                fVar60 = auVar29._4_4_;
                local_24c8._4_4_ = fVar60 * local_2518._4_4_;
                fVar61 = auVar29._8_4_;
                local_24c8._8_4_ = fVar61 * local_2518._8_4_;
                fVar62 = auVar29._12_4_;
                local_24c8._12_4_ = fVar62 * local_2518._12_4_;
                auVar52 = ZEXT1664(local_24c8);
                local_24e8[0] = fVar48 * local_2538._0_4_;
                local_24e8[1] = fVar60 * local_2538._4_4_;
                local_24e8[2] = fVar61 * local_2538._8_4_;
                local_24e8[3] = fVar62 * local_2538._12_4_;
                local_24d8[0] = fVar48 * local_2528._0_4_;
                local_24d8[1] = fVar60 * local_2528._4_4_;
                local_24d8[2] = fVar61 * local_2528._8_4_;
                local_24d8[3] = fVar62 * local_2528._12_4_;
                local_25a8 = context->scene;
                auVar50._8_4_ = 0x7f800000;
                auVar50._0_8_ = 0x7f8000007f800000;
                auVar50._12_4_ = 0x7f800000;
                auVar29 = vblendmps_avx512vl(auVar50,local_24c8);
                auVar38._0_4_ =
                     (uint)(local_24f7 & 1) * auVar29._0_4_ |
                     (uint)!(bool)(local_24f7 & 1) * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 1 & 1);
                auVar38._4_4_ = (uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 2 & 1);
                auVar38._8_4_ = (uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_24f7 >> 3 & 1);
                auVar38._12_4_ = (uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * 0x7f800000;
                auVar29 = vshufps_avx(auVar38,auVar38,0xb1);
                auVar29 = vminps_avx(auVar29,auVar38);
                auVar37 = vshufpd_avx(auVar29,auVar29,1);
                auVar29 = vminps_avx(auVar37,auVar29);
                uVar7 = vcmpps_avx512vl(auVar38,auVar29,0);
                local_260c = (uint)local_24f7;
                uVar66 = (uint)((byte)uVar7 & local_24f7);
                if (((byte)uVar7 & local_24f7) == 0) {
                  uVar66 = local_260c;
                }
                uVar21 = 0;
                for (uVar20 = (ulong)uVar66; (uVar20 & 1) == 0;
                    uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                  uVar21 = uVar21 + 1;
                }
                do {
                  local_2550 = *(uint *)(lVar22 + 0x90 + uVar21 * 4);
                  local_25e8 = (ulong)local_2550;
                  local_25e0 = (local_25a8->geometries).items[local_2550].ptr;
                  if ((local_25e0->mask & (ray->super_RayK<1>).mask) == 0) {
                    local_260c = (uint)(~(byte)(1 << ((uint)uVar21 & 0x1f)) & (byte)local_260c);
                    bVar4 = true;
                  }
                  else {
                    local_25f0 = context->args;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (local_25e0->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar4 = false;
                    }
                    else {
                      local_2488 = auVar52._0_16_;
                      local_2478 = auVar82._0_32_;
                      local_2458 = auVar81._0_32_;
                      local_2438 = auVar80._0_32_;
                      local_2418 = auVar79._0_32_;
                      local_23f8 = auVar77._0_32_;
                      local_23d8 = auVar76._0_32_;
                      local_23b8 = auVar75._0_32_;
                      local_2598.context = context->user;
                      local_2568 = *(float *)(local_24b8 + uVar21 * 4);
                      local_2564 = *(undefined4 *)(local_24a8 + uVar21 * 4);
                      local_2560 = *(undefined4 *)(local_2498 + uVar21 * 4);
                      local_255c = local_24e8[uVar21];
                      local_2558 = local_24d8[uVar21];
                      local_2554 = *(undefined4 *)(lVar22 + 0xa0 + uVar21 * 4);
                      local_254c = (local_2598.context)->instID[0];
                      local_2548 = (local_2598.context)->instPrimID[0];
                      fVar48 = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar21 * 4);
                      local_25f4 = -1;
                      local_2598.valid = &local_25f4;
                      local_2598.geometryUserPtr = local_25e0->userPtr;
                      local_2598.ray = (RTCRayN *)ray;
                      local_2598.hit = (RTCHitN *)&local_2568;
                      local_2598.N = 1;
                      if ((local_25e0->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*local_25e0->intersectionFilterN)(&local_2598), *local_2598.valid != 0))
                      {
                        if (local_25f0->filter != (RTCFilterFunctionN)0x0) {
                          if (((local_25f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((local_25e0->field_8).field_0x2 & 0x40) != 0)) {
                            (*local_25f0->filter)(&local_2598);
                          }
                          if (*local_2598.valid == 0) goto LAB_01fd114f;
                        }
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_2598.hit;
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_2598.hit + 4);
                        (((Vec3f *)((long)local_2598.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_2598.hit + 8);
                        *(float *)((long)local_2598.ray + 0x3c) = *(float *)(local_2598.hit + 0xc);
                        *(float *)((long)local_2598.ray + 0x40) = *(float *)(local_2598.hit + 0x10);
                        *(float *)((long)local_2598.ray + 0x44) = *(float *)(local_2598.hit + 0x14);
                        *(float *)((long)local_2598.ray + 0x48) = *(float *)(local_2598.hit + 0x18);
                        *(float *)((long)local_2598.ray + 0x4c) = *(float *)(local_2598.hit + 0x1c);
                        *(float *)((long)local_2598.ray + 0x50) = *(float *)(local_2598.hit + 0x20);
                      }
                      else {
LAB_01fd114f:
                        (ray->super_RayK<1>).tfar = fVar48;
                      }
                      auVar52 = ZEXT1664(local_2488);
                      fVar48 = (ray->super_RayK<1>).tfar;
                      auVar16._4_4_ = fVar48;
                      auVar16._0_4_ = fVar48;
                      auVar16._8_4_ = fVar48;
                      auVar16._12_4_ = fVar48;
                      uVar7 = vcmpps_avx512vl(local_2488,auVar16,2);
                      local_260c = (uint)(byte)(~(byte)(1 << ((uint)uVar21 & 0x1f)) &
                                                (byte)local_260c & (byte)uVar7);
                      bVar4 = true;
                      auVar75 = ZEXT3264(local_23b8);
                      auVar76 = ZEXT3264(local_23d8);
                      auVar77 = ZEXT3264(local_23f8);
                      auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
                      auVar78 = ZEXT3264(auVar40);
                      auVar79 = ZEXT3264(local_2418);
                      auVar80 = ZEXT3264(local_2438);
                      auVar81 = ZEXT3264(local_2458);
                      auVar82 = ZEXT3264(local_2478);
                      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                      auVar83 = ZEXT3264(auVar40);
                      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                      auVar84 = ZEXT3264(auVar40);
                      auVar29 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                      auVar85 = ZEXT1664(auVar29);
                      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar86 = ZEXT3264(auVar40);
                      auVar40 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                      auVar87 = ZEXT3264(auVar40);
                    }
                  }
                  if (!bVar4) {
                    fVar48 = local_24e8[uVar21];
                    fVar60 = local_24d8[uVar21];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c8 + uVar21 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24b8 + uVar21 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24a8 + uVar21 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2498 + uVar21 * 4);
                    ray->u = fVar48;
                    ray->v = fVar60;
                    ray->primID = *(uint *)(lVar22 + 0xa0 + uVar21 * 4);
                    ray->geomID = (uint)local_25e8;
                    pRVar3 = context->user;
                    ray->instID[0] = pRVar3->instID[0];
                    ray->instPrimID[0] = pRVar3->instPrimID[0];
                    break;
                  }
                  bVar17 = (byte)local_260c;
                  if (bVar17 == 0) break;
                  auVar51._8_4_ = 0x7f800000;
                  auVar51._0_8_ = 0x7f8000007f800000;
                  auVar51._12_4_ = 0x7f800000;
                  auVar29 = vblendmps_avx512vl(auVar51,auVar52._0_16_);
                  auVar39._0_4_ =
                       (uint)(bVar17 & 1) * auVar29._0_4_ | (uint)!(bool)(bVar17 & 1) * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 1) & 1);
                  auVar39._4_4_ = (uint)bVar4 * auVar29._4_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 2) & 1);
                  auVar39._8_4_ = (uint)bVar4 * auVar29._8_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_260c >> 3) & 1);
                  auVar39._12_4_ = (uint)bVar4 * auVar29._12_4_ | (uint)!bVar4 * 0x7f800000;
                  auVar29 = vshufps_avx(auVar39,auVar39,0xb1);
                  auVar29 = vminps_avx(auVar29,auVar39);
                  auVar37 = vshufpd_avx(auVar29,auVar29,1);
                  auVar29 = vminps_avx(auVar37,auVar29);
                  uVar7 = vcmpps_avx512vl(auVar39,auVar29,0);
                  bVar17 = (byte)uVar7 & bVar17;
                  uVar66 = local_260c;
                  if (bVar17 != 0) {
                    uVar66 = (uint)bVar17;
                  }
                  uVar67 = 0;
                  for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x80000000) {
                    uVar67 = uVar67 + 1;
                  }
                  uVar21 = (ulong)uVar67;
                } while( true );
              }
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 != uVar24 - 8);
        }
        fVar48 = (ray->super_RayK<1>).tfar;
        auVar52 = ZEXT3264(CONCAT428(fVar48,CONCAT424(fVar48,CONCAT420(fVar48,CONCAT416(fVar48,
                                                  CONCAT412(fVar48,CONCAT48(fVar48,CONCAT44(fVar48,
                                                  fVar48))))))));
        in_ZMM9 = ZEXT3264(local_2398);
        uVar24 = local_25a0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }